

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence.cpp
# Opt level: O3

vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_> *
spvtools::opt::anon_unknown_15::GetAllTopLevelRecurrences
          (vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
           *__return_storage_ptr__,SENode *node)

{
  pointer ppSVar1;
  int iVar2;
  undefined4 extraout_var;
  vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
  *pvVar3;
  vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
  *extraout_RAX;
  vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
  *extraout_RAX_00;
  pointer ppSVar4;
  SERecurrentNode *recurrent_node;
  vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
  local_38;
  undefined4 extraout_var_00;
  
  (__return_storage_ptr__->
  super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar2 = (*node->_vptr_SENode[6])(node);
  local_38.
  super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(extraout_var,iVar2);
  if (local_38.
      super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    std::vector<spvtools::opt::SERecurrentNode*,std::allocator<spvtools::opt::SERecurrentNode*>>::
    _M_realloc_insert<spvtools::opt::SERecurrentNode*const&>
              ((vector<spvtools::opt::SERecurrentNode*,std::allocator<spvtools::opt::SERecurrentNode*>>
                *)__return_storage_ptr__,(iterator)0x0,(SERecurrentNode **)&local_38);
  }
  iVar2 = (*node->_vptr_SENode[8])(node);
  pvVar3 = (vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
            *)CONCAT44(extraout_var_00,iVar2);
  if (pvVar3 != (vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                 *)0x0) {
    ppSVar1 = (pvVar3->
              super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
              )._M_impl.super__Vector_impl_data._M_end_of_storage;
    for (ppSVar4 = (pvVar3->
                   super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                   )._M_impl.super__Vector_impl_data._M_finish; ppSVar4 != ppSVar1;
        ppSVar4 = ppSVar4 + 1) {
      GetAllTopLevelRecurrences(&local_38,&(*ppSVar4)->super_SENode);
      std::vector<spvtools::opt::SERecurrentNode*,std::allocator<spvtools::opt::SERecurrentNode*>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<spvtools::opt::SERecurrentNode**,std::vector<spvtools::opt::SERecurrentNode*,std::allocator<spvtools::opt::SERecurrentNode*>>>>
                ((vector<spvtools::opt::SERecurrentNode*,std::allocator<spvtools::opt::SERecurrentNode*>>
                  *)__return_storage_ptr__,
                 (__return_storage_ptr__->
                 super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                 )._M_impl.super__Vector_impl_data._M_finish,
                 local_38.
                 super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 local_38.
                 super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      pvVar3 = extraout_RAX;
      if (local_38.
          super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_38.
                        super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_38.
                              super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_38.
                              super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
        pvVar3 = extraout_RAX_00;
      }
    }
  }
  return pvVar3;
}

Assistant:

std::vector<SERecurrentNode*> GetAllTopLevelRecurrences(SENode* node) {
  auto nodes = std::vector<SERecurrentNode*>{};
  if (auto recurrent_node = node->AsSERecurrentNode()) {
    nodes.push_back(recurrent_node);
  }

  if (auto add_node = node->AsSEAddNode()) {
    for (auto child : add_node->GetChildren()) {
      auto child_nodes = GetAllTopLevelRecurrences(child);
      nodes.insert(nodes.end(), child_nodes.begin(), child_nodes.end());
    }
  }

  return nodes;
}